

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O3

FiniteAutomaton *
Omega_h::FiniteAutomaton::make_set_nfa
          (FiniteAutomaton *__return_storage_ptr__,int nsymbols,
          set<int,_std::less<int>,_std::allocator<int>_> *accepted,int token)

{
  int from_state;
  int to_state;
  _Rb_tree_node_base *p_Var1;
  
  FiniteAutomaton(__return_storage_ptr__,nsymbols,true,2);
  from_state = add_state(__return_storage_ptr__);
  to_state = add_state(__return_storage_ptr__);
  for (p_Var1 = (accepted->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(accepted->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    add_transition(__return_storage_ptr__,from_state,p_Var1[1]._M_color,to_state);
  }
  add_accept(__return_storage_ptr__,to_state,token);
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton FiniteAutomaton::make_set_nfa(
    int nsymbols, std::set<int> const& accepted, int token) {
  FiniteAutomaton out(nsymbols, true, 2);
  auto start_state = add_state(out);
  auto accept_state = add_state(out);
  for (auto i : accepted) {
    add_transition(out, start_state, i, accept_state);
  }
  add_accept(out, accept_state, token);
  return out;
}